

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dataset_metadata.cpp
# Opt level: O2

void __thiscall
dlib::image_dataset_metadata::doc_handler::characters(doc_handler *this,string *data)

{
  bool bVar1;
  ulong uVar2;
  char *trim_chars;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  pointer pbVar3;
  
  pbVar4 = (this->ts).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->ts).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  trim_chars = (char *)((long)pbVar3 - (long)pbVar4);
  if (trim_chars == (char *)0x40) {
    bVar1 = std::operator==(pbVar4 + 1,"name");
    if (bVar1) {
      trim<char,std::char_traits<char>,std::allocator<char>>
                (&bStack_38,(dlib *)data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" \t\r\n",
                 trim_chars);
      std::__cxx11::string::_M_assign((string *)&this->meta->name);
      goto LAB_00233ef2;
    }
    pbVar4 = (this->ts).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->ts).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  uVar2 = (long)pbVar3 - (long)pbVar4;
  if (uVar2 == 0x40) {
    bVar1 = std::operator==(pbVar4 + 1,"comment");
    if (bVar1) {
      trim<char,std::char_traits<char>,std::allocator<char>>
                (&bStack_38,(dlib *)data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" \t\r\n",
                 trim_chars);
      std::__cxx11::string::_M_assign((string *)&this->meta->comment);
      goto LAB_00233ef2;
    }
    pbVar4 = (this->ts).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(this->ts).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4;
  }
  if (uVar2 < 0x21) {
    return;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&pbVar4[-1]._M_dataplus._M_p + uVar2),"label");
  if (!bVar1) {
    return;
  }
  bVar1 = std::operator==((this->ts).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -2,"box");
  if (!bVar1) {
    return;
  }
  trim<char,std::char_traits<char>,std::allocator<char>>
            (&bStack_38,(dlib *)data,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" \t\r\n",
             trim_chars);
  std::__cxx11::string::_M_assign((string *)&(this->temp_box).label);
LAB_00233ef2:
  std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

virtual void characters ( 
                const std::string& data
            )
            {
                if (ts.size() == 2 && ts[1] == "name")
                {
                    meta.name = trim(data);
                }
                else if (ts.size() == 2 && ts[1] == "comment")
                {
                    meta.comment = trim(data);
                }
                else if (ts.size() >= 2 && ts[ts.size()-1] == "label" && 
                                           ts[ts.size()-2] == "box")
                {
                    temp_box.label = trim(data);
                }
            }